

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<VkSpecParser::TypedName>::emplace<VkSpecParser::TypedName>
          (QGenericArrayOps<VkSpecParser::TypedName> *this,qsizetype i,TypedName *args)

{
  undefined1 uVar1;
  uint uVar2;
  qsizetype qVar3;
  undefined8 in_RDX;
  QArrayDataPointer<VkSpecParser::TypedName> *in_RSI;
  QArrayDataPointer<VkSpecParser::TypedName> *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  TypedName tmp;
  TypedName *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  undefined1 uVar5;
  undefined2 in_stack_ffffffffffffff44;
  byte bVar6;
  GrowthPosition where;
  Inserter local_a0;
  undefined1 local_50 [72];
  long local_8;
  
  where = (GrowthPosition)((ulong)in_RDX >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = QArrayDataPointer<VkSpecParser::TypedName>::needsDetach
                    ((QArrayDataPointer<VkSpecParser::TypedName> *)
                     CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
  if (!(bool)uVar1) {
    if ((in_RSI == (QArrayDataPointer<VkSpecParser::TypedName> *)in_RDI->size) &&
       (qVar3 = QArrayDataPointer<VkSpecParser::TypedName>::freeSpaceAtEnd(in_RDI), qVar3 != 0)) {
      QArrayDataPointer<VkSpecParser::TypedName>::end
                ((QArrayDataPointer<VkSpecParser::TypedName> *)
                 CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
      VkSpecParser::TypedName::TypedName
                ((TypedName *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                 in_stack_ffffffffffffff28);
      in_RDI->size = in_RDI->size + 1;
      goto LAB_00114582;
    }
    if ((in_RSI == (QArrayDataPointer<VkSpecParser::TypedName> *)0x0) &&
       (qVar3 = QArrayDataPointer<VkSpecParser::TypedName>::freeSpaceAtBegin(in_RDI), qVar3 != 0)) {
      QArrayDataPointer<VkSpecParser::TypedName>::begin
                ((QArrayDataPointer<VkSpecParser::TypedName> *)0x11444a);
      VkSpecParser::TypedName::TypedName
                ((TypedName *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                 in_stack_ffffffffffffff28);
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      goto LAB_00114582;
    }
  }
  memset(local_50,0xaa,0x48);
  VkSpecParser::TypedName::TypedName
            ((TypedName *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
             in_stack_ffffffffffffff28);
  bVar4 = in_RDI->size != 0;
  uVar5 = bVar4 && in_RSI == (QArrayDataPointer<VkSpecParser::TypedName> *)0x0;
  uVar2 = (uint)(bVar4 && in_RSI == (QArrayDataPointer<VkSpecParser::TypedName> *)0x0);
  bVar6 = uVar5;
  QArrayDataPointer<VkSpecParser::TypedName>::detachAndGrow
            (in_RSI,where,CONCAT17(uVar1,CONCAT16(uVar5,CONCAT24(in_stack_ffffffffffffff44,uVar2))),
             (TypedName **)in_RDI,
             (QArrayDataPointer<VkSpecParser::TypedName> *)CONCAT17(uVar5,in_stack_ffffffffffffff30)
            );
  if ((bVar6 & 1) == 0) {
    Inserter::Inserter(&local_a0,in_RDI);
    Inserter::insertOne((Inserter *)
                        CONCAT17(uVar1,CONCAT16(bVar6,CONCAT24(in_stack_ffffffffffffff44,uVar2))),
                        (qsizetype)in_RDI,(TypedName *)CONCAT17(uVar5,in_stack_ffffffffffffff30));
    Inserter::~Inserter(&local_a0);
  }
  else {
    QArrayDataPointer<VkSpecParser::TypedName>::begin
              ((QArrayDataPointer<VkSpecParser::TypedName> *)0x114512);
    VkSpecParser::TypedName::TypedName
              ((TypedName *)CONCAT17(uVar5,in_stack_ffffffffffffff30),in_stack_ffffffffffffff28);
    in_RDI->ptr = in_RDI->ptr + -1;
    in_RDI->size = in_RDI->size + 1;
  }
  VkSpecParser::TypedName::~TypedName((TypedName *)CONCAT17(uVar5,in_stack_ffffffffffffff30));
LAB_00114582:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }